

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::InlineOpaquePass::InlineOpaque(InlineOpaquePass *this,Function *func)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Status SVar4;
  UnderlyingIterator UVar5;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar6;
  BasicBlock *pBVar7;
  Instruction *inst;
  Status SVar8;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  newVars;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  newBlocks;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> local_a8;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *local_98;
  Function *local_90;
  undefined1 local_88 [24];
  pointer puStack_70;
  undefined8 local_68;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  local_58;
  iterator local_38;
  
  local_98 = &func->blocks_;
  UVar5._M_current =
       (func->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a8.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       local_a8.container_;
  local_a8.container_ = local_98;
  SVar8 = Failure;
  pvVar6 = local_98;
  local_90 = func;
  while( true ) {
    local_a8.iterator_._M_current = UVar5._M_current;
    bVar1 = (local_90->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == UVar5._M_current;
    bVar2 = pvVar6 == local_98;
    if (bVar1 && bVar2) break;
    pBVar7 = ((UVar5._M_current)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    inst = *(Instruction **)
            ((long)&(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    while (inst != &(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      bVar3 = InlinePass::IsInlinableFunctionCall(&this->super_InlinePass,inst);
      if ((bVar3) && (bVar3 = HasOpaqueArgsOrReturn(this,inst), bVar3)) {
        local_58.
        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.
        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68 = 0;
        local_88._16_8_ = (pointer)0x0;
        puStack_70 = (pointer)0x0;
        local_88._8_8_ = inst;
        bVar3 = InlinePass::GenInlineCode
                          (&this->super_InlinePass,&local_58,
                           (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                            *)(local_88 + 0x10),(iterator *)(local_88 + 8),local_a8);
        if (bVar3) {
          if (8 < (ulong)((long)local_58.
                                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58.
                               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
            InlinePass::UpdateSucceedingPhis(&this->super_InlinePass,&local_58);
          }
          local_a8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::Erase<false>(&local_a8);
          local_a8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
                               (&local_a8,&local_58);
          if (puStack_70 != (pointer)local_88._16_8_) {
            local_88._0_8_ =
                 *(undefined8 *)
                  ((long)(((local_98->
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t + 0x20);
            InstructionList::iterator::InsertBefore
                      (&local_38,
                       (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                        *)local_88);
          }
          inst = *(Instruction **)
                  ((long)&((((local_a8.iterator_._M_current)->_M_t).
                            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)
                          ->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
          SVar8 = 1;
        }
        std::
        vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ::~vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                   *)(local_88 + 0x10));
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::~vector(&local_58);
        if (!bVar3) goto LAB_001f3544;
      }
      else {
        inst = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
      UVar5._M_current = local_a8.iterator_._M_current;
      pBVar7 = ((local_a8.iterator_._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    }
    UVar5._M_current = UVar5._M_current + 1;
    pvVar6 = local_a8.container_;
  }
LAB_001f3544:
  SVar4 = Failure;
  if (bVar1 && bVar2) {
    SVar4 = SVar8 ^ SuccessWithoutChange;
  }
  return SVar4;
}

Assistant:

Pass::Status InlineOpaquePass::InlineOpaque(Function* func) {
  bool modified = false;
  // Using block iterators here because of block erasures and insertions.
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end();) {
      if (IsInlinableFunctionCall(&*ii) && HasOpaqueArgsOrReturn(&*ii)) {
        // Inline call.
        std::vector<std::unique_ptr<BasicBlock>> newBlocks;
        std::vector<std::unique_ptr<Instruction>> newVars;
        if (!GenInlineCode(&newBlocks, &newVars, ii, bi)) {
          return Status::Failure;
        }

        // If call block is replaced with more than one block, point
        // succeeding phis at new last block.
        if (newBlocks.size() > 1) UpdateSucceedingPhis(newBlocks);
        // Replace old calling block with new block(s).
        bi = bi.Erase();
        bi = bi.InsertBefore(&newBlocks);
        // Insert new function variables.
        if (newVars.size() > 0)
          func->begin()->begin().InsertBefore(std::move(newVars));
        // Restart inlining at beginning of calling block.
        ii = bi->begin();
        modified = true;
      } else {
        ++ii;
      }
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}